

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall libserver::server::_write_to_socket(server *this,string *_send_message)

{
  undefined8 uVar1;
  error_code local_68;
  const_buffer local_58;
  const_buffer *local_48 [2];
  error_code local_38;
  _Alloc_hider local_28;
  size_type local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18;
  
  local_58.data_ = (_send_message->_M_dataplus)._M_p;
  local_58.size_ = _send_message->_M_string_length;
  local_48[0] = &local_58;
  local_68.val_ = 0;
  local_68._4_4_ = local_68._4_4_ & 0xffffff00;
  local_68.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::asio::detail::
  write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::const_buffer_const*,boost::asio::detail::transfer_exactly_t>
            (&this->socket,(const_buffers_1 *)local_48[0],(const_buffer **)local_48,
             (transfer_exactly_t)local_58.size_,&local_68);
  local_38.cat_ = local_68.cat_;
  if (local_68.failed_ != true) {
    return;
  }
  uVar1._4_1_ = local_68.failed_;
  uVar1._5_3_ = local_68._5_3_;
  uVar1._0_4_ = local_68.val_;
  std::runtime_error::runtime_error((runtime_error *)local_48,"write");
  local_48[0] = (const_buffer *)&PTR__system_error_001352e0;
  local_28._M_p = (pointer)((long)&((system_error *)local_48)->m_what + 0x10);
  local_20 = 0;
  local_18._M_local_buf[0] = '\0';
  local_38._0_8_ = uVar1;
  boost::throw_exception<boost::system::system_error>((system_error *)local_48);
}

Assistant:

void libserver::server::_write_to_socket(const std::string& _send_message)
{   
    boost::system::error_code ec;
    boost::asio::write(socket,boost::asio::buffer(_send_message),boost::asio::transfer_exactly(_send_message.length()),&ec);

    if(ec)
    {
        std::cout<<"Error while writing "<<ec<<std::endl;
    }

}